

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O0

void __thiscall soplex::VectorBase<double>::reDim(VectorBase<double> *this,int newdim,bool setZero)

{
  int iVar1;
  iterator __x;
  undefined1 in_DL;
  int in_ESI;
  const_iterator in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  int iVar3;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  if (((char)(uVar2 >> 0x18) != '\0') &&
     (iVar3 = in_ESI, iVar1 = dim((VectorBase<double> *)0x262ae8), iVar1 < in_ESI)) {
    __x = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffb8);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffffb8);
    dim((VectorBase<double> *)0x262b22);
    std::vector<double,_std::allocator<double>_>::insert
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,uVar2),in_RDI,
               in_stack_ffffffffffffffe8,__x._M_current);
    return;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reDim(int newdim, const bool setZero = true)
   {
      if(setZero && newdim > dim())
      {
         // Inserts 0 to the rest of the vectors.
         //
         // TODO: Is this important after the change of raw pointers to
         // std::vector. This is just a waste of operations, I think.
         val.insert(val.end(), newdim - VectorBase<R>::dim(), 0);
      }
      else
      {
         val.resize(newdim);
      }

   }